

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::python::Generator::
PrintDescriptorOptionsFixingCode<google::protobuf::MethodDescriptor>
          (Generator *this,MethodDescriptor *descriptor,Proto *proto,string_view descriptor_str)

{
  Printer *this_00;
  string_view pc;
  bool bVar1;
  MethodOptions *this_01;
  Generator *pGVar2;
  AlphaNum *c;
  AlphaNum *in_R9;
  string_view serialized_options;
  string_view local_2a0;
  undefined4 local_28c;
  basic_string_view<char,_std::char_traits<char>_> local_288;
  AlphaNum local_278;
  AlphaNum local_248;
  basic_string_view<char,_std::char_traits<char>_> local_218;
  AlphaNum local_208;
  AlphaNum local_1d8;
  string local_1a8;
  AlphaNum local_188;
  Generator *local_158;
  size_t sStack_150;
  AlphaNum local_140;
  AlphaNum local_110;
  string local_e0;
  undefined1 local_c0 [8];
  string descriptor_name;
  size_t dot_pos;
  string local_88;
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  string options;
  Proto *proto_local;
  MethodDescriptor *descriptor_local;
  Generator *this_local;
  string_view descriptor_str_local;
  
  c = (AlphaNum *)descriptor_str._M_str;
  pGVar2 = (Generator *)descriptor_str._M_len;
  options.field_2._8_8_ = proto;
  this_local = pGVar2;
  descriptor_str_local._M_len = (size_t)c;
  this_01 = MethodDescriptorProto::options(proto);
  MessageLite::SerializeAsString_abi_cxx11_(&local_88,(MessageLite *)this_01);
  local_68 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_88);
  serialized_options._M_len = local_68._8_8_;
  serialized_options._M_str = (char *)pGVar2;
  python::(anonymous_namespace)::OptionsValue_abi_cxx11_
            ((string *)local_58,local_68._0_8_,serialized_options);
  std::__cxx11::string::~string((string *)&local_88);
  descriptor_name.field_2._8_8_ =
       std::basic_string_view<char,_std::char_traits<char>_>::find
                 ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,'.',0);
  std::__cxx11::string::string((string *)local_c0);
  if (descriptor_name.field_2._8_8_ == -1) {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_110,"_globals[\'");
    local_158 = this_local;
    sStack_150 = descriptor_str_local._M_len;
    pc._M_str = (char *)descriptor_str_local._M_len;
    pc._M_len = (size_t)this_local;
    absl::lts_20250127::AlphaNum::AlphaNum(&local_140,pc);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_188,"\']");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_e0,(lts_20250127 *)&local_110,&local_140,&local_188,c);
    std::__cxx11::string::operator=((string *)local_c0,(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  else {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_1d8,"_globals[\'");
    local_218 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,0,
                           descriptor_name.field_2._8_8_);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_208,local_218);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_248,"\']");
    local_288 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,
                           descriptor_name.field_2._8_8_,0xffffffffffffffff);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_278,local_288);
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_1a8,(lts_20250127 *)&local_1d8,&local_208,&local_248,&local_278,in_R9);
    std::__cxx11::string::operator=((string *)local_c0,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58,"None");
  if (!bVar1) {
    this_00 = this->printer_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_2a0,
               "$descriptor_name$._loaded_options = None\n$descriptor_name$._serialized_options = $serialized_value$\n"
              );
    io::Printer::Print<char[16],std::__cxx11::string,char[17],std::__cxx11::string>
              (this_00,local_2a0,(char (*) [16])0xa147a2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
               (char (*) [17])"serialized_value",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  }
  descriptor_str_local._M_str._7_1_ = !bVar1;
  local_28c = 1;
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string((string *)local_58);
  return (bool)(descriptor_str_local._M_str._7_1_ & 1);
}

Assistant:

bool Generator::PrintDescriptorOptionsFixingCode(
    const DescriptorT& descriptor, const typename DescriptorT::Proto& proto,
    absl::string_view descriptor_str) const {
  std::string options = OptionsValue(proto.options().SerializeAsString());

  // Reset the _options to None thus DescriptorBase.GetOptions() can
  // parse _options again after extensions are registered.
  size_t dot_pos = descriptor_str.find('.');
  std::string descriptor_name;
  if (dot_pos == std::string::npos) {
    descriptor_name = absl::StrCat("_globals['", descriptor_str, "']");
  } else {
    descriptor_name =
        absl::StrCat("_globals['", descriptor_str.substr(0, dot_pos), "']",
                     descriptor_str.substr(dot_pos));
  }

  if (options == "None") {
    return false;
  }

  printer_->Print(
      "$descriptor_name$._loaded_options = None\n"
      "$descriptor_name$._serialized_options = $serialized_value$\n",
      "descriptor_name", descriptor_name, "serialized_value", options);
  return true;
}